

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTTBoard.cpp
# Opt level: O1

bool __thiscall TTTBoard::IsDraw(TTTBoard *this)

{
  bool bVar1;
  int i;
  long lVar2;
  long lVar3;
  
  bVar1 = true;
  lVar2 = 0;
  do {
    lVar3 = 1;
    do {
      if (*(int *)((long)(this->m_board + -1) + 8 + lVar3 * 4) == 2) {
        bVar1 = false;
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 != 4);
    lVar2 = lVar2 + 1;
    this = (TTTBoard *)(this->m_board[0] + 2);
  } while (lVar2 != 3);
  return bVar1;
}

Assistant:

bool TTTBoard::IsDraw() const
{
    bool draw = true;

    // Check if every cell is a blank
    for(int i = 0; i < MAX_ROWS; ++i)
    {
        for(int j = 0; j < MAX_COLS; ++j)
        {
            if(m_board[i][j] == BLANK)
                draw = false;
        }
    }

    return draw;
}